

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primitives.cpp
# Opt level: O0

void skiwi::compile_reclaim(asmcode *code,compiler_options *ops)

{
  skiwi *this;
  uint64_t in_RDX;
  operation local_64;
  operand local_60;
  operation local_5c [5];
  int local_48 [4];
  undefined1 local_38 [8];
  string reclaim;
  compiler_options *ops_local;
  asmcode *code_local;
  
  this = label;
  label = label + 1;
  reclaim.field_2._8_8_ = ops;
  label_to_string_abi_cxx11_((string *)local_38,this,in_RDX);
  local_48[3] = 5;
  local_48[2] = 0x10;
  local_48[1] = 0x23;
  local_48[0] = 0x50;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)(local_48 + 3),(operand *)(local_48 + 2),(operand *)(local_48 + 1),
             local_48);
  local_5c[1] = 0x3b;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,local_5c + 1,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38);
  local_5c[0] = JMP;
  local_60 = RBX;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (code,local_5c,&local_60);
  local_64 = LABEL;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,&local_64,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38);
  compile_reclaim_garbage(code,(compiler_options *)reclaim.field_2._8_8_);
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void compile_reclaim(asmcode& code, const compiler_options& ops)
  {
  auto reclaim = label_to_string(label++);
  code.add(asmcode::CMP, ALLOC, LIMIT);
  code.add(asmcode::JGS, reclaim);
  code.add(asmcode::JMP, CONTINUE);
  code.add(asmcode::LABEL, reclaim);
  compile_reclaim_garbage(code, ops);
  }